

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

double bsc_bcast_2phase_costs(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double local_30;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  uVar2 = 0;
  local_30 = bsc_L(BSC_PUT);
  if (n < iVar1) {
    uVar3 = (ulong)(uint)n;
    if (n < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 0x30 - uVar2 != 0; uVar2 = uVar2 + 0x30) {
      dVar4 = bsc_g(BSC_PUT,(*(int *)((long)&set->size + uVar2) + iVar1 + -1) / iVar1);
      local_30 = local_30 + (double)*(int *)((long)&set->size + uVar2) * dVar4;
    }
  }
  else {
    uVar3 = (ulong)(uint)n;
    if (n < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 0x30 - uVar2 != 0; uVar2 = uVar2 + 0x30) {
      dVar4 = bsc_g(BSC_PUT,*(int *)((long)&set->size + uVar2));
      local_30 = local_30 + (double)*(int *)((long)&set->size + uVar2) * dVar4;
    }
  }
  return local_30 + local_30;
}

Assistant:

double bsc_bcast_2phase_costs(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double one_phase = bsc_L(BSC_PUT);

    /* Note: the following is only an estimate */

    if ( n < P ) {
        for ( i = 0; i < n ; ++i ) 
            one_phase += bsc_g(BSC_PUT, (set[i].size+P-1)/P) * set[i].size ;
    } else {
        for ( i = 0 ; i < n; ++i )
            one_phase += bsc_g(BSC_PUT, set[i].size) * set[i].size;
    }

    return 2.0 * one_phase;
}